

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::(anonymous_namespace)::formatDuration_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,double seconds)

{
  long lVar1;
  long lVar2;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar3;
  size_t sVar4;
  ReusableStringStream rss;
  ReusableStringStream local_28;
  
  local_28.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001825b8;
  pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar4 = StringStreams::add(&pSVar3->super_StringStreams);
  local_28.m_index = sVar4;
  pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  local_28.m_oss =
       *(ostream **)
        &(pSVar3->super_StringStreams).m_streams.
         super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar4]._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  lVar1 = *(long *)local_28.m_oss;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)((long)local_28.m_oss + lVar2 + 0x18) =
       *(uint *)((long)local_28.m_oss + lVar2 + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_28.m_oss + *(long *)(lVar1 + -0x18) + 8) = 3;
  std::ostream::_M_insert<double>(seconds);
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string formatDuration( double seconds ) {
            ReusableStringStream rss;
            rss << std::fixed << std::setprecision( 3 ) << seconds;
            return rss.str();
        }